

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

bool __thiscall deqp::gls::DrawTest::compare(DrawTest *this,Primitive primitiveType)

{
  long lVar1;
  ostringstream *poVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  RGBA RVar6;
  RGBA RVar7;
  AttributePack *pAVar8;
  AttributePack *pAVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar16;
  TestLog *pTVar17;
  int iVar18;
  Surface *target;
  Surface *target_00;
  ConstPixelBufferAccess *pCVar19;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  ChannelOrder CVar20;
  void *pvVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int local_5b8;
  int local_5b0;
  int local_5ac;
  int local_5a4;
  int iStack_57c;
  ulong local_578;
  IVec3 renderTargetThreshold;
  IVec3 local_54c;
  IVec4 green;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  RGBA screenPixel_1;
  undefined4 uStack_4ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  _Alloc_hider local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  PixelBufferAccess errorAccess;
  undefined1 local_448 [40];
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  IVec4 red;
  RGBA refPixel;
  ChannelType CStack_38c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  _Alloc_hider local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360 [6];
  RGBA screenPixel;
  ChannelType CStack_2fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0 [6];
  TestLog *local_270;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [4];
  ios_base local_1f0 [264];
  RGBA refPixel_1;
  int iStack_e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [6];
  TextureLevel errorMask;
  
  pAVar8 = this->m_rrArrayPack;
  pAVar9 = this->m_glArrayPack;
  iVar14 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  if (1 < *(int *)(CONCAT44(extraout_var,iVar14) + 0x20)) {
    res.m_data._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(res.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!"
               ,0x8a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_1f0);
    pTVar17 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    refPixel.m_value = RGBA;
    CStack_38c = UNORM_INT8;
    pvVar21 = (void *)(pAVar8->m_screen).m_pixels.m_cap;
    if (pvVar21 != (void *)0x0) {
      pvVar21 = (pAVar8->m_screen).m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&res,(TextureFormat *)&refPixel,(pAVar8->m_screen).m_width,
               (pAVar8->m_screen).m_height,1,pvVar21);
    screenPixel.m_value = RGBA;
    CStack_2fc = UNORM_INT8;
    pvVar21 = (void *)(pAVar9->m_screen).m_pixels.m_cap;
    if (pvVar21 != (void *)0x0) {
      pvVar21 = (pAVar9->m_screen).m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&refPixel,(TextureFormat *)&screenPixel,
               (pAVar9->m_screen).m_width,(pAVar9->m_screen).m_height,1,pvVar21);
    bVar11 = tcu::fuzzyCompare(pTVar17,"Compare Results","Compare Results",
                               (ConstPixelBufferAccess *)&res,(ConstPixelBufferAccess *)&refPixel,
                               0.3,COMPARE_LOG_RESULT);
    return bVar11;
  }
  target_00 = &pAVar8->m_screen;
  target = &pAVar9->m_screen;
  bVar11 = false;
  switch(primitiveType) {
  case PRIMITIVE_POINTS:
    pTVar17 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    refPixel.m_value = RGBA;
    CStack_38c = UNORM_INT8;
    pvVar21 = (void *)(pAVar8->m_screen).m_pixels.m_cap;
    if (pvVar21 != (void *)0x0) {
      pvVar21 = (pAVar8->m_screen).m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&res,(TextureFormat *)&refPixel,(pAVar8->m_screen).m_width,
               (pAVar8->m_screen).m_height,1,pvVar21);
    screenPixel.m_value = RGBA;
    CStack_2fc = UNORM_INT8;
    pvVar21 = (void *)(pAVar9->m_screen).m_pixels.m_cap;
    if (pvVar21 != (void *)0x0) {
      pvVar21 = (pAVar9->m_screen).m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&refPixel,(TextureFormat *)&screenPixel,
               (pAVar9->m_screen).m_width,(pAVar9->m_screen).m_height,1,pvVar21);
    screenPixel.m_value = this->m_maxDiffRed;
    CStack_2fc = this->m_maxDiffGreen;
    _refPixel_1 = &DAT_100000001;
    bVar11 = tcu::intThresholdPositionDeviationErrorThresholdCompare
                       (pTVar17,"CompareResult","Result of rendering",(ConstPixelBufferAccess *)&res
                        ,(ConstPixelBufferAccess *)&refPixel,(UVec4 *)&screenPixel,
                        (IVec3 *)&refPixel_1,true,0,COMPARE_LOG_RESULT);
    return bVar11;
  case PRIMITIVE_TRIANGLES:
  case PRIMITIVE_TRIANGLE_FAN:
  case PRIMITIVE_TRIANGLE_STRIP:
  case PRIMITIVE_TRIANGLES_ADJACENCY:
  case PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
    iVar14 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    lVar16 = CONCAT44(extraout_var_00,iVar14);
    CVar20 = R;
    if (0 < *(int *)(lVar16 + 0x14)) {
      CVar20 = 0x1000000 << (8U - (char)*(int *)(lVar16 + 0x14) & 0x1f);
    }
    screenPixel.m_value =
         0x100 << (8U - *(char *)(lVar16 + 0xc) & 0x1f) |
         1 << ((byte)(8 - *(char *)(lVar16 + 8)) & 0x1f) |
         0x10000 << (8U - *(char *)(lVar16 + 0x10) & 0x1f) | CVar20;
    tcu::RGBA::toIVec(&refPixel);
    res.m_data._0_8_ = &refPixel;
    res.m_data[2] = 0;
    res.m_data[3] = 1;
    local_258._M_allocated_capacity._0_4_ = 2;
    renderTargetThreshold.m_data[0] = 0;
    renderTargetThreshold.m_data[1] = 0;
    renderTargetThreshold.m_data[2] = 0;
    lVar16 = 2;
    do {
      (&renderTargetThreshold)[-1].m_data[lVar16 + 1] = (&refPixel)[res.m_data[lVar16]].m_value;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 5);
    local_270 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    uVar3 = this->m_maxDiffRed;
    iVar4 = this->m_maxDiffGreen;
    iVar5 = this->m_maxDiffBlue;
    green.m_data[0] = 0;
    green.m_data[1] = 0xff;
    green.m_data[2] = 0;
    green.m_data[3] = 0xff;
    red.m_data[0] = 0xff;
    red.m_data[1] = 0;
    red.m_data[2] = 0;
    red.m_data[3] = 0xff;
    iVar24 = (pAVar8->m_screen).m_width;
    iVar18 = (pAVar8->m_screen).m_height;
    res.m_data[0] = 7;
    res.m_data[1] = 3;
    local_54c.m_data[0] = uVar3;
    local_54c.m_data[1] = iVar4;
    local_54c.m_data[2] = iVar5;
    tcu::TextureLevel::TextureLevel(&errorMask,(TextureFormat *)&res,iVar24,iVar18,1);
    tcu::TextureLevel::getAccess(&errorAccess,&errorMask);
    tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,0,iVar24,1);
    tcu::clear((PixelBufferAccess *)&res,&green);
    iVar14 = iVar18 + -1;
    tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,iVar14,iVar24,1);
    tcu::clear((PixelBufferAccess *)&res,&green);
    tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,0,1,iVar18);
    tcu::clear((PixelBufferAccess *)&res,&green);
    iVar24 = iVar24 + -1;
    tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,iVar24,0,1,iVar18);
    tcu::clear((PixelBufferAccess *)&res,&green);
    local_5ac = 0;
    if (1 < iVar14) {
      local_5b8 = 1;
      iVar18 = 0;
      local_5a4 = 2;
      local_5ac = 0;
      do {
        if (1 < iVar24) {
          iVar22 = 1;
          local_578 = 0;
          do {
            RVar6.m_value =
                 *(deUint32 *)
                  ((long)(pAVar8->m_screen).m_pixels.m_ptr +
                  (long)((pAVar8->m_screen).m_width * local_5b8 + iVar22) * 4);
            refPixel_1.m_value = RVar6.m_value;
            RVar7.m_value =
                 *(deUint32 *)
                  ((long)(pAVar9->m_screen).m_pixels.m_ptr +
                  (long)((pAVar9->m_screen).m_width * local_5b8 + iVar22) * 4);
            screenPixel_1.m_value = RVar7.m_value;
            bVar11 = tcu::compareThresholdMasked
                               (RVar6,RVar7,(RGBA)(iVar5 << 0x10 | iVar4 << 8 | uVar3),7);
            if (bVar11) {
LAB_018a565e:
              if ((RVar7.m_value & 0xffffff) == 0) {
                res.m_data[0] = 0;
              }
              else {
                res.m_data[0] =
                     ((RVar7.m_value >> 8 & 0xff) +
                      (RVar7.m_value >> 0x10 & 0xff) + (RVar7.m_value & 0xff) >> 3) + 0x32;
              }
              res.m_data[1] = 0xff;
              res.m_data[3] = 0xff;
              res.m_data[2] = res.m_data[0];
              tcu::PixelBufferAccess::setPixel(&errorAccess,&res,iVar22,local_5b8,0);
            }
            else {
              bVar11 = pixelNeighborhoodContainsColor
                                 (target,iVar22,local_5b8,&refPixel_1,&local_54c);
              bVar13 = pixelNeighborhoodContainsColor
                                 (target_00,iVar22,local_5b8,&screenPixel_1,&local_54c);
              if (bVar11 && bVar13) goto LAB_018a565e;
              iVar15 = (pAVar8->m_screen).m_width;
              pvVar21 = (pAVar8->m_screen).m_pixels.m_ptr;
              iVar23 = (int)local_578 + iVar18 * iVar15;
              bVar11 = false;
              lVar16 = -1;
              do {
                res.m_data[0] = *(int *)((long)pvVar21 + (long)iVar23 * 4);
                refPixel.m_value = *(ChannelOrder *)((long)pvVar21 + (long)(iVar23 + 1) * 4);
                screenPixel.m_value = *(ChannelOrder *)((long)pvVar21 + (long)(iVar23 + 2) * 4);
                bVar13 = isEdgeTriplet((RGBA *)&res,&refPixel,&screenPixel,&renderTargetThreshold);
                if (bVar13) {
                  if (!bVar11) goto LAB_018a57f1;
                  break;
                }
                lVar1 = lVar16 + 1;
                bVar11 = 0 < lVar16;
                iVar23 = iVar23 + iVar15;
                lVar16 = lVar1;
              } while (lVar1 != 2);
              iVar23 = (int)local_578;
              bVar11 = true;
              lVar16 = 0;
              do {
                iVar10 = (int)lVar16;
                res.m_data[0] =
                     *(int *)((long)pvVar21 + (long)(iVar18 * iVar15 + iVar23 + iVar10) * 4);
                refPixel.m_value =
                     *(ChannelOrder *)
                      ((long)pvVar21 + (long)(iVar10 + iVar15 * local_5b8 + iVar23) * 4);
                screenPixel.m_value =
                     *(ChannelOrder *)
                      ((long)pvVar21 + (long)(local_5a4 * iVar15 + iVar23 + iVar10) * 4);
                bVar13 = isEdgeTriplet((RGBA *)&res,&refPixel,&screenPixel,&renderTargetThreshold);
                if (bVar13) break;
                bVar11 = lVar16 == 1 || lVar16 + -1 < 0;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              if (bVar11) {
LAB_018a57f1:
                bVar11 = pixelNeighborhoodContainsCoverage
                                   (target,iVar22,local_5b8,(RVar6.m_value & 0xffffff) != 0);
                bVar13 = pixelNeighborhoodContainsCoverage
                                   (target_00,iVar22,local_5b8,(RVar7.m_value & 0xffffff) != 0);
                if ((bVar11) && (bVar13)) {
                  if ((RVar7.m_value & 0xffffff) == 0) {
                    res.m_data[0] = 0;
                  }
                  else {
                    res.m_data[0] =
                         ((RVar7.m_value >> 8 & 0xff) +
                          (RVar7.m_value >> 0x10 & 0xff) + (RVar7.m_value & 0xff) >> 3) + 0x32;
                  }
                  res.m_data[1] = 0xff;
                  res.m_data[3] = 0xff;
                  res.m_data[2] = res.m_data[0];
                  tcu::PixelBufferAccess::setPixel(&errorAccess,&res,iVar22,local_5b8,0);
                }
                else {
                  tcu::PixelBufferAccess::setPixel(&errorAccess,&red,iVar22,local_5b8,0);
                  local_5ac = local_5ac + 1;
                }
              }
              else {
                tcu::PixelBufferAccess::setPixel(&errorAccess,&red,iVar22,local_5b8,0);
                local_5ac = local_5ac + 1;
              }
            }
            iVar22 = iVar22 + 1;
            local_578 = (ulong)((int)local_578 + 1);
          } while (iVar22 != iVar24);
        }
        local_5b8 = local_5b8 + 1;
        iVar18 = iVar18 + 1;
        local_5a4 = local_5a4 + 1;
      } while (local_5b8 != iVar14);
    }
    pTVar17 = local_270;
    poVar2 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = local_270;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Comparing images:\n",0x12)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"\tallowed deviation in pixel positions = 1\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"\tnumber of allowed invalid pixels = ",0x24);
    std::ostream::operator<<(poVar2,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"\tnumber of invalid pixels = ",0x1c);
    std::ostream::operator<<(poVar2,local_5ac);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_1f0);
    bVar11 = local_5ac < 0xb;
    if (local_5ac < 0xb) {
      local_2f0._M_allocated_capacity._0_5_ = 0x61706d6f43;
      local_2f0._M_allocated_capacity._5_3_ = 0x526572;
      local_2f0._8_5_ = 0x746c757365;
      local_2f0._M_local_buf[0xd] = '\0';
      res.m_data[0] = 0x13;
      res.m_data[1] = 0;
      _screenPixel = (TextureFormat)&local_2f0;
      _refPixel_1 = (pointer)&local_d8;
      _refPixel_1 = (pointer)std::__cxx11::string::_M_create((ulong *)&refPixel_1,(ulong)&res);
      local_d8._M_allocated_capacity._0_4_ = res.m_data[0];
      local_d8._M_allocated_capacity._4_4_ = res.m_data[1];
      *(undefined8 *)_refPixel_1 = 0x6f20746c75736552;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 8) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 9) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 10) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xb) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xc) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xd) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xe) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xf) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xf) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0x10) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0x11) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0x12) = 'g';
      _refPixel_1[res.m_data._0_8_] = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&refPixel,(string *)&screenPixel,(string *)&refPixel_1);
      tcu::TestLog::startImageSet(pTVar17,(char *)_refPixel,local_370._M_p);
      local_4a0._M_allocated_capacity._0_4_ = 0x75736552;
      local_4a0._M_allocated_capacity._4_2_ = 0x746c;
      local_4a0._M_local_buf[6] = '\0';
      local_448._16_4_ = 0x75736552;
      local_448._20_2_ = 0x746c;
      local_448._8_8_ = 6;
      local_448[0x16] = '\0';
      _screenPixel_1 = (pointer)&local_4a0;
      local_448._0_8_ = (long)local_448 + 0x10;
      tcu::LogImage::LogImage
                ((LogImage *)&res,(string *)&screenPixel_1,(string *)local_448,target,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&res,(int)pTVar17,__buf_00,(size_t)target);
      tcu::TestLog::endImageSet(pTVar17);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != local_238) {
        operator_delete(local_248._M_p,local_238[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res.m_data._0_8_ != &local_258) {
        operator_delete((void *)res.m_data._0_8_,
                        CONCAT44(local_258._M_allocated_capacity._4_4_,
                                 local_258._M_allocated_capacity._0_4_) + 1);
      }
      if (local_448._0_8_ != (long)local_448 + 0x10) {
        operator_delete((void *)local_448._0_8_,
                        CONCAT17(local_448[0x17],
                                 CONCAT16(local_448[0x16],
                                          CONCAT24(local_448._20_2_,local_448._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_screenPixel_1 != &local_4a0) {
        operator_delete(_screenPixel_1,
                        CONCAT17(local_4a0._M_local_buf[7],
                                 CONCAT16(local_4a0._M_local_buf[6],
                                          CONCAT24(local_4a0._M_allocated_capacity._4_2_,
                                                   local_4a0._M_allocated_capacity._0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_p != local_360) {
        operator_delete(local_370._M_p,local_360[0]._M_allocated_capacity + 1);
      }
      if (_refPixel != (TextureFormat)&local_380) {
        operator_delete((void *)_refPixel,local_380._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_refPixel_1 != &local_d8) {
        operator_delete(_refPixel_1,local_d8._M_allocated_capacity + 1);
      }
      if (_screenPixel != (TextureFormat)&local_2f0) {
        operator_delete((void *)_screenPixel,
                        CONCAT35(local_2f0._M_allocated_capacity._5_3_,
                                 local_2f0._M_allocated_capacity._0_5_) + 1);
      }
    }
    else {
      poVar2 = (ostringstream *)(res.m_data + 2);
      res.m_data._0_8_ = pTVar17;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Image comparison failed. Color threshold = (",0x2c);
      std::ostream::operator<<(poVar2,local_54c.m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
      std::ostream::operator<<(poVar2,local_54c.m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
      std::ostream::operator<<(poVar2,local_54c.m_data[2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
      pTVar17 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      local_4d0.field_2._M_allocated_capacity._0_5_ = 0x61706d6f43;
      local_4d0.field_2._M_allocated_capacity._5_3_ = 0x526572;
      local_4d0.field_2._8_5_ = 0x746c757365;
      local_4d0._M_string_length = 0xd;
      local_4d0.field_2._M_local_buf[0xd] = '\0';
      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
      refPixel.m_value = S;
      CStack_38c = SNORM_INT8;
      local_530._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_530,(ulong)&refPixel);
      local_530.field_2._M_allocated_capacity._0_4_ = refPixel.m_value;
      local_530.field_2._M_allocated_capacity._4_4_ = CStack_38c;
      builtin_strncpy(local_530._M_dataplus._M_p,"Result of rendering",0x13);
      local_530._M_string_length._0_4_ = refPixel.m_value;
      local_530._M_string_length._4_4_ = CStack_38c;
      local_530._M_dataplus._M_p[(long)_refPixel] = '\0';
      tcu::LogImageSet::LogImageSet((LogImageSet *)&screenPixel_1,&local_4d0,&local_530);
      tcu::TestLog::startImageSet(pTVar17,_screenPixel_1,local_490._M_p);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      local_4f0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_4f0.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_4f0._M_string_length = 6;
      local_4f0.field_2._M_local_buf[6] = '\0';
      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      local_510.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_510.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_510._M_string_length = 6;
      local_510.field_2._M_local_buf[6] = '\0';
      tcu::LogImage::LogImage
                ((LogImage *)&refPixel,&local_4f0,&local_510,target,QP_IMAGE_COMPRESSION_MODE_BEST);
      iVar14 = (int)pTVar17;
      tcu::LogImage::write((LogImage *)&refPixel,iVar14,__buf_01,(size_t)target);
      local_3c0.field_2._M_allocated_capacity = 0x636e657265666552;
      local_3c0.field_2._8_2_ = 0x65;
      local_3c0._M_string_length = 9;
      local_3e0.field_2._M_allocated_capacity = 0x636e657265666552;
      local_3e0.field_2._8_2_ = 0x65;
      local_3e0._M_string_length = 9;
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      tcu::LogImage::LogImage
                ((LogImage *)&screenPixel,&local_3c0,&local_3e0,target_00,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&screenPixel,iVar14,__buf_02,(size_t)target_00);
      local_400.field_2._M_allocated_capacity = 0x73614d726f727245;
      local_400.field_2._8_2_ = 0x6b;
      local_400._M_string_length = 9;
      local_420.field_2._M_allocated_capacity = 0x616d20726f727245;
      local_420.field_2._8_2_ = 0x6b73;
      local_420._M_string_length = 10;
      local_420.field_2._M_local_buf[10] = '\0';
      local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
      local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_448,&errorMask);
      pCVar19 = (ConstPixelBufferAccess *)local_448;
      tcu::LogImage::LogImage
                ((LogImage *)&refPixel_1,&local_400,&local_420,pCVar19,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&refPixel_1,iVar14,__buf_03,(size_t)pCVar19);
      tcu::TestLog::endImageSet(pTVar17);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != local_b8) {
        operator_delete(local_c8._M_p,local_b8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_refPixel_1 != &local_d8) {
        operator_delete(_refPixel_1,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) {
        operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_p != local_2d0) {
        operator_delete(local_2e0._M_p,local_2d0[0]._M_allocated_capacity + 1);
      }
      if (_screenPixel != (TextureFormat)&local_2f0) {
        operator_delete((void *)_screenPixel,
                        CONCAT35(local_2f0._M_allocated_capacity._5_3_,
                                 local_2f0._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_p != local_360) {
        operator_delete(local_370._M_p,local_360[0]._M_allocated_capacity + 1);
      }
      if (_refPixel != (TextureFormat)&local_380) {
        operator_delete((void *)_refPixel,local_380._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,
                        CONCAT17(local_510.field_2._M_local_buf[7],
                                 CONCAT16(local_510.field_2._M_local_buf[6],
                                          CONCAT24(local_510.field_2._M_allocated_capacity._4_2_,
                                                   local_510.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,
                        CONCAT17(local_4f0.field_2._M_local_buf[7],
                                 CONCAT16(local_4f0.field_2._M_local_buf[6],
                                          CONCAT24(local_4f0.field_2._M_allocated_capacity._4_2_,
                                                   local_4f0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_p != &local_480) {
        operator_delete(local_490._M_p,local_480._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_screenPixel_1 != &local_4a0) {
        operator_delete(_screenPixel_1,
                        CONCAT17(local_4a0._M_local_buf[7],
                                 CONCAT16(local_4a0._M_local_buf[6],
                                          CONCAT24(local_4a0._M_allocated_capacity._4_2_,
                                                   local_4a0._M_allocated_capacity._0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,
                        CONCAT35(local_4d0.field_2._M_allocated_capacity._5_3_,
                                 local_4d0.field_2._M_allocated_capacity._0_5_) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(res.m_data + 2));
      std::ios_base::~ios_base(local_1f0);
    }
    break;
  case PRIMITIVE_LINES:
  case PRIMITIVE_LINE_STRIP:
  case PRIMITIVE_LINE_LOOP:
  case PRIMITIVE_LINES_ADJACENCY:
  case PRIMITIVE_LINE_STRIP_ADJACENCY:
    pTVar17 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    uVar3 = this->m_maxDiffRed;
    iVar4 = this->m_maxDiffGreen;
    renderTargetThreshold.m_data[0] = this->m_maxDiffRed;
    renderTargetThreshold.m_data[1] = this->m_maxDiffGreen;
    iVar5 = this->m_maxDiffBlue;
    green.m_data[0] = 0;
    green.m_data[1] = 0xff;
    green.m_data[2] = 0;
    green.m_data[3] = 0xff;
    red.m_data[0] = 0xff;
    red.m_data[1] = 0;
    red.m_data[2] = 0;
    red.m_data[3] = 0xff;
    iVar24 = (pAVar8->m_screen).m_width;
    iVar18 = (pAVar8->m_screen).m_height;
    res.m_data[0] = 7;
    res.m_data[1] = 3;
    renderTargetThreshold.m_data[2] = iVar5;
    tcu::TextureLevel::TextureLevel(&errorMask,(TextureFormat *)&res,iVar24,iVar18,1);
    tcu::TextureLevel::getAccess(&errorAccess,&errorMask);
    tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,0,iVar24,1);
    tcu::clear((PixelBufferAccess *)&res,&green);
    iVar14 = iVar18 + -1;
    tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,iVar14,iVar24,1);
    tcu::clear((PixelBufferAccess *)&res,&green);
    tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,0,0,1,iVar18);
    tcu::clear((PixelBufferAccess *)&res,&green);
    tcu::getSubregion((PixelBufferAccess *)&res,&errorAccess,iVar24 + -1,0,1,iVar18);
    tcu::clear((PixelBufferAccess *)&res,&green);
    local_5b0 = 0;
    if (1 < iVar14) {
      local_578 = (ulong)(2 - iVar24);
      local_5b0 = 0;
      iVar18 = 1;
      do {
        if (1 < iVar24 + -1) {
          iVar22 = 1;
          do {
            RVar6.m_value =
                 *(deUint32 *)
                  ((long)(pAVar8->m_screen).m_pixels.m_ptr +
                  (long)((pAVar8->m_screen).m_width * iVar18 + iVar22) * 4);
            refPixel.m_value = RVar6.m_value;
            RVar7.m_value =
                 *(deUint32 *)
                  ((long)(pAVar9->m_screen).m_pixels.m_ptr +
                  (long)((pAVar9->m_screen).m_width * iVar18 + iVar22) * 4);
            screenPixel.m_value = RVar7.m_value;
            bVar13 = tcu::compareThresholdMasked
                               (RVar6,RVar7,(RGBA)(iVar5 << 0x10 | iVar4 << 8 | uVar3),7);
            bVar12 = true;
            bVar11 = true;
            if (!bVar13) {
              bVar11 = pixelNeighborhoodContainsColor
                                 (target_00,iVar22,iVar18,&screenPixel,&renderTargetThreshold);
              bVar12 = pixelNeighborhoodContainsColor
                                 (target,iVar22,iVar18,&refPixel,&renderTargetThreshold);
            }
            if ((bVar11 & bVar12) == 1) {
              if ((RVar7.m_value & 0xffffff) == 0) {
                res.m_data[0] = 0;
              }
              else {
                res.m_data[0] =
                     ((RVar7.m_value >> 8 & 0xff) +
                      (RVar7.m_value >> 0x10 & 0xff) + (RVar7.m_value & 0xff) >> 3) + 0x32;
              }
              res.m_data[1] = 0xff;
              res.m_data[3] = 0xff;
              res.m_data[2] = res.m_data[0];
              tcu::PixelBufferAccess::setPixel(&errorAccess,&res,iVar22,iVar18,0);
            }
            else {
              bVar11 = pixelNearLineIntersection(iVar22,iVar18,target_00);
              if ((bVar11) || (bVar11 = pixelNearLineIntersection(iVar22,iVar18,target), bVar11)) {
                bVar11 = pixelNeighborhoodContainsCoverage
                                   (target_00,iVar22,iVar18,(RVar7.m_value & 0xffffff) != 0);
                bVar13 = pixelNeighborhoodContainsCoverage
                                   (target,iVar22,iVar18,(RVar6.m_value & 0xffffff) != 0);
                if ((bVar11) && (bVar13)) {
                  if ((RVar7.m_value & 0xffffff) == 0) {
                    res.m_data[0] = 0;
                  }
                  else {
                    res.m_data[0] =
                         ((RVar7.m_value >> 8 & 0xff) +
                          (RVar7.m_value >> 0x10 & 0xff) + (RVar7.m_value & 0xff) >> 3) + 0x32;
                  }
                  res.m_data[1] = 0xff;
                  res.m_data[3] = 0xff;
                  res.m_data[2] = res.m_data[0];
                  tcu::PixelBufferAccess::setPixel(&errorAccess,&res,iVar22,iVar18,0);
                  goto LAB_018a4fe1;
                }
                tcu::PixelBufferAccess::setPixel(&errorAccess,&red,iVar22,iVar18,0);
              }
              else {
                tcu::PixelBufferAccess::setPixel(&errorAccess,&red,iVar22,iVar18,0);
              }
              local_5b0 = local_5b0 + 1;
            }
LAB_018a4fe1:
            iVar15 = (int)local_578 + iVar22;
            iVar22 = iVar22 + 1;
          } while (iVar15 != 0);
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 != iVar14);
    }
    poVar2 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar17;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Comparing images:\n",0x12)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"\tallowed deviation in pixel positions = 1\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"\tnumber of allowed invalid pixels = ",0x24);
    std::ostream::operator<<(poVar2,5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"\tnumber of invalid pixels = ",0x1c);
    std::ostream::operator<<(poVar2,local_5b0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_1f0);
    bVar11 = local_5b0 < 6;
    if (local_5b0 < 6) {
      local_2f0._M_allocated_capacity._0_5_ = 0x61706d6f43;
      local_2f0._M_allocated_capacity._5_3_ = 0x526572;
      local_2f0._8_5_ = 0x746c757365;
      local_2f0._M_local_buf[0xd] = '\0';
      res.m_data[0] = 0x13;
      res.m_data[1] = 0;
      _screenPixel = (TextureFormat)&local_2f0;
      _refPixel_1 = (pointer)&local_d8;
      _refPixel_1 = (pointer)std::__cxx11::string::_M_create((ulong *)&refPixel_1,(ulong)&res);
      local_d8._M_allocated_capacity._0_4_ = res.m_data[0];
      local_d8._M_allocated_capacity._4_4_ = res.m_data[1];
      *(undefined8 *)_refPixel_1 = 0x6f20746c75736552;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 8) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 9) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 10) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xb) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xc) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xd) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xe) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xf) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0xf) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0x10) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0x11) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_refPixel_1 + 0x12) = 'g';
      _refPixel_1[res.m_data._0_8_] = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&refPixel,(string *)&screenPixel,(string *)&refPixel_1);
      tcu::TestLog::startImageSet(pTVar17,(char *)_refPixel,local_370._M_p);
      local_4a0._M_allocated_capacity._0_4_ = 0x75736552;
      local_4a0._M_allocated_capacity._4_2_ = 0x746c;
      local_4a0._M_local_buf[6] = '\0';
      local_448._16_4_ = 0x75736552;
      local_448._20_2_ = 0x746c;
      local_448._8_8_ = 6;
      local_448[0x16] = '\0';
      _screenPixel_1 = (pointer)&local_4a0;
      local_448._0_8_ = (long)local_448 + 0x10;
      tcu::LogImage::LogImage
                ((LogImage *)&res,(string *)&screenPixel_1,(string *)local_448,target,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&res,(int)pTVar17,__buf,(size_t)target);
      tcu::TestLog::endImageSet(pTVar17);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != local_238) {
        operator_delete(local_248._M_p,local_238[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res.m_data._0_8_ != &local_258) {
        operator_delete((void *)res.m_data._0_8_,
                        CONCAT44(local_258._M_allocated_capacity._4_4_,
                                 local_258._M_allocated_capacity._0_4_) + 1);
      }
      if (local_448._0_8_ != (long)local_448 + 0x10) {
        operator_delete((void *)local_448._0_8_,
                        CONCAT17(local_448[0x17],
                                 CONCAT16(local_448[0x16],
                                          CONCAT24(local_448._20_2_,local_448._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_screenPixel_1 != &local_4a0) {
        operator_delete(_screenPixel_1,
                        CONCAT17(local_4a0._M_local_buf[7],
                                 CONCAT16(local_4a0._M_local_buf[6],
                                          CONCAT24(local_4a0._M_allocated_capacity._4_2_,
                                                   local_4a0._M_allocated_capacity._0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_p != local_360) {
        operator_delete(local_370._M_p,local_360[0]._M_allocated_capacity + 1);
      }
      if (_refPixel != (TextureFormat)&local_380) {
        operator_delete((void *)_refPixel,local_380._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_refPixel_1 != &local_d8) {
        operator_delete(_refPixel_1,local_d8._M_allocated_capacity + 1);
      }
      if (_screenPixel != (TextureFormat)&local_2f0) {
        operator_delete((void *)_screenPixel,
                        CONCAT35(local_2f0._M_allocated_capacity._5_3_,
                                 local_2f0._M_allocated_capacity._0_5_) + 1);
      }
    }
    else {
      poVar2 = (ostringstream *)(res.m_data + 2);
      res.m_data._0_8_ = pTVar17;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Image comparison failed. Color threshold = (",0x2c);
      std::ostream::operator<<(poVar2,uVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
      std::ostream::operator<<(poVar2,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
      std::ostream::operator<<(poVar2,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,")",1);
      pTVar17 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      local_4d0.field_2._M_allocated_capacity._0_5_ = 0x61706d6f43;
      local_4d0.field_2._M_allocated_capacity._5_3_ = 0x526572;
      local_4d0.field_2._8_5_ = 0x746c757365;
      local_4d0._M_string_length = 0xd;
      local_4d0.field_2._M_local_buf[0xd] = '\0';
      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
      refPixel.m_value = S;
      CStack_38c = SNORM_INT8;
      local_530._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_530,(ulong)&refPixel);
      local_530.field_2._M_allocated_capacity._0_4_ = refPixel.m_value;
      local_530.field_2._M_allocated_capacity._4_4_ = CStack_38c;
      builtin_strncpy(local_530._M_dataplus._M_p,"Result of rendering",0x13);
      local_530._M_string_length._0_4_ = refPixel.m_value;
      local_530._M_string_length._4_4_ = CStack_38c;
      local_530._M_dataplus._M_p[(long)_refPixel] = '\0';
      tcu::LogImageSet::LogImageSet((LogImageSet *)&screenPixel_1,&local_4d0,&local_530);
      tcu::TestLog::startImageSet(pTVar17,_screenPixel_1,local_490._M_p);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      local_4f0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_4f0.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_4f0._M_string_length = 6;
      local_4f0.field_2._M_local_buf[6] = '\0';
      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      local_510.field_2._M_allocated_capacity._0_4_ = 0x75736552;
      local_510.field_2._M_allocated_capacity._4_2_ = 0x746c;
      local_510._M_string_length = 6;
      local_510.field_2._M_local_buf[6] = '\0';
      tcu::LogImage::LogImage
                ((LogImage *)&refPixel,&local_4f0,&local_510,target,QP_IMAGE_COMPRESSION_MODE_BEST);
      iVar14 = (int)pTVar17;
      tcu::LogImage::write((LogImage *)&refPixel,iVar14,__buf_04,(size_t)target);
      local_3c0.field_2._M_allocated_capacity = 0x636e657265666552;
      local_3c0.field_2._8_2_ = 0x65;
      local_3c0._M_string_length = 9;
      local_3e0.field_2._M_allocated_capacity = 0x636e657265666552;
      local_3e0.field_2._8_2_ = 0x65;
      local_3e0._M_string_length = 9;
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      tcu::LogImage::LogImage
                ((LogImage *)&screenPixel,&local_3c0,&local_3e0,target_00,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&screenPixel,iVar14,__buf_05,(size_t)target_00);
      local_400.field_2._M_allocated_capacity = 0x73614d726f727245;
      local_400.field_2._8_2_ = 0x6b;
      local_400._M_string_length = 9;
      local_420.field_2._M_allocated_capacity = 0x616d20726f727245;
      local_420.field_2._8_2_ = 0x6b73;
      local_420._M_string_length = 10;
      local_420.field_2._M_local_buf[10] = '\0';
      local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
      local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_448,&errorMask);
      pCVar19 = (ConstPixelBufferAccess *)local_448;
      tcu::LogImage::LogImage
                ((LogImage *)&refPixel_1,&local_400,&local_420,pCVar19,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&refPixel_1,iVar14,__buf_06,(size_t)pCVar19);
      tcu::TestLog::endImageSet(pTVar17);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != local_b8) {
        operator_delete(local_c8._M_p,local_b8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_refPixel_1 != &local_d8) {
        operator_delete(_refPixel_1,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) {
        operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_p != local_2d0) {
        operator_delete(local_2e0._M_p,local_2d0[0]._M_allocated_capacity + 1);
      }
      if (_screenPixel != (TextureFormat)&local_2f0) {
        operator_delete((void *)_screenPixel,
                        CONCAT35(local_2f0._M_allocated_capacity._5_3_,
                                 local_2f0._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_p != local_360) {
        operator_delete(local_370._M_p,local_360[0]._M_allocated_capacity + 1);
      }
      if (_refPixel != (TextureFormat)&local_380) {
        operator_delete((void *)_refPixel,local_380._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,
                        CONCAT17(local_510.field_2._M_local_buf[7],
                                 CONCAT16(local_510.field_2._M_local_buf[6],
                                          CONCAT24(local_510.field_2._M_allocated_capacity._4_2_,
                                                   local_510.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,
                        CONCAT17(local_4f0.field_2._M_local_buf[7],
                                 CONCAT16(local_4f0.field_2._M_local_buf[6],
                                          CONCAT24(local_4f0.field_2._M_allocated_capacity._4_2_,
                                                   local_4f0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_p != &local_480) {
        operator_delete(local_490._M_p,local_480._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_screenPixel_1 != &local_4a0) {
        operator_delete(_screenPixel_1,
                        CONCAT17(local_4a0._M_local_buf[7],
                                 CONCAT16(local_4a0._M_local_buf[6],
                                          CONCAT24(local_4a0._M_allocated_capacity._4_2_,
                                                   local_4a0._M_allocated_capacity._0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,
                        CONCAT35(local_4d0.field_2._M_allocated_capacity._5_3_,
                                 local_4d0.field_2._M_allocated_capacity._0_5_) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(res.m_data + 2));
      std::ios_base::~ios_base(local_1f0);
    }
    break;
  default:
    goto switchD_018a4aca_default;
  }
  tcu::TextureLevel::~TextureLevel(&errorMask);
switchD_018a4aca_default:
  return bVar11;
}

Assistant:

bool DrawTest::compare (gls::DrawTestSpec::Primitive primitiveType)
{
	const tcu::Surface&	ref		= m_rrArrayPack->getSurface();
	const tcu::Surface&	screen	= m_glArrayPack->getSurface();

	if (m_renderCtx.getRenderTarget().getNumSamples() > 1)
	{
		// \todo [mika] Improve compare when using multisampling
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: Comparision of result from multisample render targets are not as stricts as without multisampling. Might produce false positives!" << tcu::TestLog::EndMessage;
		return tcu::fuzzyCompare(m_testCtx.getLog(), "Compare Results", "Compare Results", ref.getAccess(), screen.getAccess(), 0.3f, tcu::COMPARE_LOG_RESULT);
	}
	else
	{
		const PrimitiveClass	primitiveClass							= getDrawPrimitiveClass(primitiveType);
		const int				maxAllowedInvalidPixelsWithPoints		= 0;	//!< points are unlikely to have overlapping fragments
		const int				maxAllowedInvalidPixelsWithLines		= 5;	//!< line are allowed to have a few bad pixels
		const int				maxAllowedInvalidPixelsWithTriangles	= 10;

		switch (primitiveClass)
		{
			case PRIMITIVECLASS_POINT:
			{
				// Point are extremely unlikely to have overlapping regions, don't allow any no extra / missing pixels
				return tcu::intThresholdPositionDeviationErrorThresholdCompare(m_testCtx.getLog(),
																			   "CompareResult",
																			   "Result of rendering",
																			   ref.getAccess(),
																			   screen.getAccess(),
																			   tcu::UVec4(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue, 256),
																			   tcu::IVec3(1, 1, 0),					//!< 3x3 search kernel
																			   true,								//!< relax comparison on the image boundary
																			   maxAllowedInvalidPixelsWithPoints,	//!< error threshold
																			   tcu::COMPARE_LOG_RESULT);
			}

			case PRIMITIVECLASS_LINE:
			{
				// Lines can potentially have a large number of overlapping pixels. Pixel comparison may potentially produce
				// false negatives in such pixels if for example the pixel in question is overdrawn by another line in the
				// reference image but not in the resultin image. Relax comparison near line intersection points (areas) and
				// compare only coverage, not color, in such pixels
				return intersectionRelaxedLineImageCompare(m_testCtx.getLog(),
														   "CompareResult",
														   "Result of rendering",
														   ref,
														   screen,
														   tcu::IVec3(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue),
														   maxAllowedInvalidPixelsWithLines);
			}

			case PRIMITIVECLASS_TRIANGLE:
			{
				// Triangles are likely to partially or fully overlap. Pixel difference comparison is fragile in pixels
				// where there could be potential overlapping since the  pixels might be covered by one triangle in the
				// reference image and by the other in the result image. Relax comparsion near primitive edges and
				// compare only coverage, not color, in such pixels.
				const tcu::IVec3	renderTargetThreshold					= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold().toIVec().xyz();

				return edgeRelaxedImageCompare(m_testCtx.getLog(),
											   "CompareResult",
											   "Result of rendering",
											   ref,
											   screen,
											   tcu::IVec3(m_maxDiffRed, m_maxDiffGreen, m_maxDiffBlue),
											   renderTargetThreshold,
											   maxAllowedInvalidPixelsWithTriangles);
			}

			default:
				DE_ASSERT(false);
				return false;
		}
	}
}